

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalid_OnlyTarget(void)

{
  string *psVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  TypeUnion TVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ostream *poVar9;
  ArrayFeatureType *pAVar10;
  long lVar11;
  int iVar12;
  void **ppvVar13;
  int iVar14;
  long lVar15;
  Model spec;
  string targetName;
  TensorAttributes tensorAttributesOut;
  Result res;
  FeatureDescription feature;
  TensorAttributes tensorAttributesIn;
  Model local_198;
  string local_168;
  TensorAttributes local_148;
  _func_int **local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes local_48;
  
  CoreML::Specification::Model::Model(&local_198);
  CoreML::Result::Result((Result *)&local_130);
  local_48.name = "InTensor";
  local_48.dimension = 3;
  local_48._12_4_ = 0;
  local_148.name = "OutTensor";
  local_148.dimension = 1;
  local_148._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_198,true,&local_48,&local_148,0x400,false,false);
  local_198.specificationversion_ = 4;
  if (local_198._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_198);
    local_198._oneof_case_[0] = 500;
    TVar5.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar5.neuralnetwork_);
    local_198.Type_.pipelineclassifier_ = TVar5.pipelineclassifier_;
  }
  TVar5 = local_198.Type_;
  addSoftmaxLayer(&local_198,"softmax","OutTensor","softmax_out");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"cce_target","");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&local_198,TVar5.neuralnetwork_,"cross_entropy_loss_layer","softmax_out",
             local_168._M_dataplus._M_p);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  if (local_198.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_198.description_ = pMVar6;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_198.description_)->traininginput_).super_RepeatedPtrFieldBase);
  if (local_198.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_198.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_198.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  psVar1 = (pTVar7->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_168);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar8->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10->datatype_ = 0x20020;
  iVar14 = (pAVar10->shape_).current_size_;
  if (iVar14 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar14 + 1);
    iVar14 = (pAVar10->shape_).current_size_;
  }
  (pAVar10->shape_).current_size_ = iVar14 + 1;
  ((pAVar10->shape_).rep_)->elements[iVar14] = 1;
  CoreML::Model::validate((Result *)local_108,&local_198);
  local_130 = (_func_int **)local_108;
  std::__cxx11::string::operator=((string *)&local_128,(string *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_p != &local_f0) {
    operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
  }
  bVar3 = CoreML::Result::good((Result *)&local_130);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5ca);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    iVar14 = 1;
    std::ostream::flush();
  }
  else {
    if (local_198.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
      local_198.description_ = pMVar6;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&((local_198.description_)->output_).super_RepeatedPtrFieldBase);
    if (local_198.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
      local_198.description_ = pMVar6;
    }
    pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&((local_198.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0)
    ;
    CoreML::Specification::FeatureDescription::set_name(pTVar7,local_148.name);
    pFVar8 = pTVar7->type_;
    if (pFVar8 == (FeatureType *)0x0) {
      pFVar8 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar8);
      pTVar7->type_ = pFVar8;
    }
    if (pFVar8->_oneof_case_[0] == 5) {
      pAVar10 = (pFVar8->Type_).multiarraytype_;
    }
    else {
      CoreML::Specification::FeatureType::clear_Type(pFVar8);
      pFVar8->_oneof_case_[0] = 5;
      pAVar10 = (ArrayFeatureType *)operator_new(0x48);
      CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
      (pFVar8->Type_).multiarraytype_ = pAVar10;
    }
    pAVar10->datatype_ = 0x10020;
    if (0 < local_148.dimension) {
      iVar14 = (pAVar10->shape_).current_size_;
      iVar12 = 0;
      iVar4 = local_148.dimension;
      do {
        if (iVar14 == (pAVar10->shape_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar14 + 1);
          iVar14 = (pAVar10->shape_).current_size_;
          iVar4 = local_148.dimension;
        }
        lVar11 = (long)iVar14;
        iVar14 = iVar14 + 1;
        (pAVar10->shape_).current_size_ = iVar14;
        ((pAVar10->shape_).rep_)->elements[lVar11] = 1;
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar4);
    }
    pMVar6 = local_198.description_;
    if (local_198.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar13 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar13 = (void **)0x0;
    }
    lVar11 = (long)(pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar11 != 0) {
      lVar15 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_108,*(FeatureDescription **)((long)ppvVar13 + lVar15)
                  );
        if (local_198.description_ == (ModelDescription *)0x0) {
          pMVar6 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
          local_198.description_ = pMVar6;
        }
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&((local_198.description_)->traininginput_).super_RepeatedPtrFieldBase,
                            (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar7,(FeatureDescription *)local_108);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_108);
        lVar15 = lVar15 + 8;
      } while (lVar11 * 8 != lVar15);
    }
    CoreML::Model::validate((Result *)local_108,&local_198);
    local_130 = (_func_int **)local_108;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
    }
    bVar3 = CoreML::Result::good((Result *)&local_130);
    iVar14 = 0;
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5db);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      iVar14 = 1;
      std::ostream::flush();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_198);
  return iVar14;
}

Assistant:

int testInvalid_OnlyTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    std::string targetName = "cce_target";
    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", targetName.c_str());

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Remove predictedFeatureName from model's outputs and add model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);    return 0;
}